

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::SolverState::InternalSerializeWithCachedSizesToArray
          (SolverState *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  int iVar2;
  string *psVar3;
  Type *value;
  UnknownFieldSet *unknown_fields;
  uint8 *puVar4;
  int index;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 2) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1,this->iter_,target);
  }
  if ((uVar1 & 1) != 0) {
    psVar3 = (this->learned_net_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.SolverState.learned_net");
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (2,(this->learned_net_).ptr_,target);
  }
  iVar2 = (this->history_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar2 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                      (&(this->history_).super_RepeatedPtrFieldBase,index);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::BlobProto>(3,value,deterministic,target);
  }
  if ((uVar1 & 4) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (4,this->current_step_,target);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    unknown_fields = SolverState::unknown_fields(this);
    puVar4 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       (unknown_fields,target);
    return puVar4;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* SolverState::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.SolverState)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 iter = 1;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->iter(), target);
  }

  // optional string learned_net = 2;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->learned_net().data(), this->learned_net().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverState.learned_net");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->learned_net(), target);
  }

  // repeated .caffe.BlobProto history = 3;
  for (unsigned int i = 0, n = this->history_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        3, this->history(i), deterministic, target);
  }

  // optional int32 current_step = 4 [default = 0];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(4, this->current_step(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.SolverState)
  return target;
}